

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FragmentStamp.cpp
# Opt level: O0

void __thiscall OpenMD::FragmentStamp::fillBondInfo(FragmentStamp *this)

{
  FragmentStamp *pFVar1;
  BondStamp *this_00;
  AtomStamp *this_01;
  undefined8 in_RDI;
  AtomStamp *atomB;
  AtomStamp *atomA;
  int b;
  int a;
  BondStamp *bondStamp;
  size_t i;
  int in_stack_ffffffffffffffbc;
  FragmentStamp *this_02;
  FragmentStamp *local_10;
  
  local_10 = (FragmentStamp *)0x0;
  while( true ) {
    this_02 = local_10;
    pFVar1 = (FragmentStamp *)getNBonds((FragmentStamp *)0x2a78c0);
    if (pFVar1 <= this_02) break;
    this_00 = getBondStamp(this_02,in_stack_ffffffffffffffbc);
    BondStamp::getA(this_00);
    BondStamp::getB(this_00);
    getAtomStamp(this_02,in_stack_ffffffffffffffbc);
    this_01 = getAtomStamp(this_02,in_stack_ffffffffffffffbc);
    AtomStamp::addBond((AtomStamp *)this_02,in_stack_ffffffffffffffbc);
    AtomStamp::addBondedAtom(this_01,(int)((ulong)in_RDI >> 0x20));
    AtomStamp::addBond((AtomStamp *)this_02,in_stack_ffffffffffffffbc);
    AtomStamp::addBondedAtom(this_01,(int)((ulong)in_RDI >> 0x20));
    local_10 = (FragmentStamp *)((long)&(local_10->super_DataHolder)._vptr_DataHolder + 1);
  }
  return;
}

Assistant:

void FragmentStamp::fillBondInfo() {
    for (std::size_t i = 0; i < getNBonds(); ++i) {
      BondStamp* bondStamp = getBondStamp(i);
      int a                = bondStamp->getA();
      int b                = bondStamp->getB();
      AtomStamp* atomA     = getAtomStamp(a);
      AtomStamp* atomB     = getAtomStamp(b);
      atomA->addBond(i);
      atomA->addBondedAtom(b);
      atomB->addBond(i);
      atomB->addBondedAtom(a);
    }
  }